

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

PPrototype * __thiscall FxExpression::ReturnProto(FxExpression *this)

{
  PPrototype *pPVar1;
  undefined1 local_30 [8];
  TArray<PType_*,_PType_*> none;
  TArray<PType_*,_PType_*> ret;
  FxExpression *this_local;
  
  if (this->ValueType != (PType *)0x0) {
    TArray<PType_*,_PType_*>::TArray((TArray<PType_*,_PType_*> *)&none.Most,0);
    TArray<PType_*,_PType_*>::TArray((TArray<PType_*,_PType_*> *)local_30,0);
    if (this->ValueType != &TypeVoid->super_PType) {
      TArray<PType_*,_PType_*>::Push((TArray<PType_*,_PType_*> *)&none.Most,&this->ValueType);
    }
    pPVar1 = NewPrototype((TArray<PType_*,_PType_*> *)&none.Most,
                          (TArray<PType_*,_PType_*> *)local_30);
    TArray<PType_*,_PType_*>::~TArray((TArray<PType_*,_PType_*> *)local_30);
    TArray<PType_*,_PType_*>::~TArray((TArray<PType_*,_PType_*> *)&none.Most);
    return pPVar1;
  }
  __assert_fail("ValueType != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x11b,"virtual PPrototype *FxExpression::ReturnProto()");
}

Assistant:

PPrototype *FxExpression::ReturnProto()
{
	assert(ValueType != nullptr);

	TArray<PType *> ret(0);
	TArray<PType *> none(0);
	if (ValueType != TypeVoid)
	{
		ret.Push(ValueType);
	}

	return NewPrototype(ret, none);
}